

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmBitImEa<(moira::Instr)31,(moira::Mode)9,1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  Imu<1> im;
  StrWriter *pSVar2;
  Ea<(moira::Mode)9,_1> dst;
  u32 local_3c;
  ushort local_38;
  u32 local_34;
  
  im.raw = dasmIncRead<1>(this,addr);
  local_38 = op & 7;
  local_3c = *addr;
  local_34 = dasmIncRead<2>(this,addr);
  SVar1 = str->style->syntax;
  pSVar2 = StrWriter::operator<<(str);
  StrWriter::operator<<(pSVar2,(Tab)(str->tab).raw);
  if ((SVar1 & ~MOIRA_MIT) == GNU) {
    pSVar2 = StrWriter::operator<<(pSVar2,(Ims<1>)im.raw);
  }
  else {
    pSVar2 = StrWriter::operator<<(pSVar2,im);
  }
  StrWriter::operator<<(pSVar2);
  StrWriter::operator<<(pSVar2,(Ea<(moira::Mode)9,_1> *)&local_3c);
  return;
}

Assistant:

void
Moira::dasmBitImEa(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = dasmIncRead<S>(addr);
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    switch (str.style.syntax) {

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            str << Ins<I>{} << str.tab << Ims<S>(src) << Sep{} << dst;
            break;

        default:

            str << Ins<I>{} << str.tab << Imu<S>(src) << Sep{} << dst;
    }
}